

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::AddCacheEntry(cmake *this,string *key,cmValue value,cmValue helpString,int type)

{
  cmMessenger *pcVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  cmValue value_local;
  
  if (helpString.Value == (string *)0x0) {
    helpString.Value = &cmValue::Empty_abi_cxx11_;
  }
  value_local = value;
  cmState::AddCacheEntry
            ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,key,value,helpString.Value,type);
  UnwatchUnusedCli(this,key);
  __y._M_str = "CMAKE_WARN_DEPRECATED";
  __y._M_len = 0x15;
  __x._M_str = (key->_M_dataplus)._M_p;
  __x._M_len = key->_M_string_length;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    pcVar1 = (this->Messenger)._M_t.
             super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
             super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
             super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
    if (value.Value == (string *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = cmValue::IsOff(&value_local);
    }
    pcVar1->SuppressDeprecatedWarnings = bVar2;
  }
  else {
    __y_00._M_str = "CMAKE_ERROR_DEPRECATED";
    __y_00._M_len = 0x16;
    __x_00._M_str = (key->_M_dataplus)._M_p;
    __x_00._M_len = key->_M_string_length;
    bVar2 = std::operator==(__x_00,__y_00);
    if (bVar2) {
      pcVar1 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      bVar2 = cmValue::IsOn(&value_local);
      pcVar1->DeprecatedWarningsAsErrors = bVar2;
    }
    else {
      __y_01._M_str = "CMAKE_SUPPRESS_DEVELOPER_WARNINGS";
      __y_01._M_len = 0x21;
      __x_01._M_str = (key->_M_dataplus)._M_p;
      __x_01._M_len = key->_M_string_length;
      bVar2 = std::operator==(__x_01,__y_01);
      if (bVar2) {
        pcVar1 = (this->Messenger)._M_t.
                 super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                 super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                 super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
        bVar2 = cmValue::IsOn(&value_local);
        pcVar1->SuppressDevWarnings = bVar2;
      }
      else {
        __y_02._M_str = "CMAKE_SUPPRESS_DEVELOPER_ERRORS";
        __y_02._M_len = 0x1f;
        __x_02._M_str = (key->_M_dataplus)._M_p;
        __x_02._M_len = key->_M_string_length;
        bVar2 = std::operator==(__x_02,__y_02);
        if (bVar2) {
          pcVar1 = (this->Messenger)._M_t.
                   super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                   super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                   super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
          if (value.Value == (string *)0x0) {
            bVar2 = false;
          }
          else {
            bVar2 = cmValue::IsOff(&value_local);
          }
          pcVar1->DevWarningsAsErrors = bVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, cmValue value,
                          cmValue helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             static_cast<cmStateEnums::CacheEntryType>(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED"_s) {
    this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());
  } else if (key == "CMAKE_ERROR_DEPRECATED"_s) {
    this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS"_s) {
    this->Messenger->SetSuppressDevWarnings(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS"_s) {
    this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());
  }
}